

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_aggregate_optimizer.cpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::CommonAggregateOptimizer::VisitReplace
          (CommonAggregateOptimizer *this,BoundColumnRefExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  bool bVar1;
  pointer ppVar2;
  long in_RDX;
  Expression *in_RDI;
  iterator entry;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_00;
  _Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_true> local_30;
  _Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_true>
  local_28 [2];
  long local_18;
  
  this_00._M_head_impl = in_RDI;
  local_18 = in_RDX;
  local_28[0]._M_cur =
       (__node_type *)
       ::std::
       unordered_map<duckdb::ColumnBinding,_duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>_>
       ::find((unordered_map<duckdb::ColumnBinding,_duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>_>
               *)in_RDI,(key_type *)0xcfa570);
  local_30._M_cur =
       (__node_type *)
       ::std::
       unordered_map<duckdb::ColumnBinding,_duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>_>
       ::end((unordered_map<duckdb::ColumnBinding,_duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>_>
              *)in_RDI);
  bVar1 = ::std::__detail::operator!=(local_28,&local_30);
  if (bVar1) {
    ppVar2 = ::std::__detail::
             _Node_iterator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_false,_true>
                           *)0xcfa5a7);
    *(idx_t *)(local_18 + 0x58) = (ppVar2->second).table_index;
    *(idx_t *)(local_18 + 0x60) = (ppVar2->second).column_index;
  }
  unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
  unique_ptr<std::default_delete<duckdb::Expression>,void>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             this_00._M_head_impl,in_RDI);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<Expression> CommonAggregateOptimizer::VisitReplace(BoundColumnRefExpression &expr,
                                                              unique_ptr<Expression> *expr_ptr) {
	// check if this column ref points to an aggregate that was remapped; if it does we remap it
	auto entry = aggregate_map.find(expr.binding);
	if (entry != aggregate_map.end()) {
		expr.binding = entry->second;
	}
	return nullptr;
}